

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pam.c
# Opt level: O2

pam_t * pam_create_from_file(char *inpath)

{
  char cVar1;
  int iVar2;
  FILE *__stream;
  pam_t *__ptr;
  char *pcVar3;
  size_t sVar4;
  uint8_t *__ptr_00;
  ulong __size;
  char *__s1;
  uint uVar5;
  bool bVar6;
  char line [1024];
  
  __stream = fopen(inpath,"r");
  if (__stream == (FILE *)0x0) {
    printf("pam.c: couldn\'t open input file: %s\n",inpath);
  }
  else {
    __ptr = (pam_t *)calloc(1,0x20);
    __ptr->type = -1;
    __ptr->width = -1;
    __ptr->height = -1;
    __ptr->depth = -1;
    __ptr->maxval = -1;
    uVar5 = 0;
    while (pcVar3 = fgets(line,0x400,__stream), pcVar3 != (char *)0x0) {
      uVar5 = uVar5 + 1;
      if (line[0] != '#') {
        sVar4 = strlen(line);
        pcVar3 = line;
        __s1 = (char *)0x0;
        while( true ) {
          pcVar3 = pcVar3 + 1;
          bVar6 = sVar4 == 0;
          sVar4 = sVar4 - 1;
          if (bVar6) break;
          cVar1 = pcVar3[-1];
          if (cVar1 == ' ') {
            pcVar3[-1] = '\0';
            if (__s1 == (char *)0x0) {
              cVar1 = '\0';
              __s1 = pcVar3;
            }
            else {
              printf("pam.c: More than two tokens, %s:%d\n",inpath,(ulong)uVar5);
              cVar1 = pcVar3[-1];
              __s1 = pcVar3;
            }
          }
          if (cVar1 == '\n') {
            pcVar3[-1] = '\0';
          }
        }
        iVar2 = bcmp(line,"P7",3);
        if (iVar2 != 0) {
          iVar2 = bcmp(line,"ENDHDR",7);
          if (iVar2 == 0) {
            if ((((__ptr->width < 0) || (__ptr->height < 0)) || (__ptr->depth < 0)) ||
               ((__ptr->maxval < 0 || (__ptr->type < 0)))) {
              pcVar3 = "pam.c: missing required metadata field";
            }
            else {
              if (__ptr->maxval != 0xff) {
                __assert_fail("pam->maxval == 255",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pam.c"
                              ,0x8c,"pam_t *pam_create_from_file(const char *)");
              }
              uVar5 = __ptr->height * __ptr->width * __ptr->depth;
              __size = (ulong)uVar5;
              __ptr->datalen = uVar5;
              __ptr_00 = (uint8_t *)malloc(__size);
              __ptr->data = __ptr_00;
              sVar4 = fread(__ptr_00,1,__size,__stream);
              if (sVar4 == __size) {
                fclose(__stream);
                return __ptr;
              }
              pcVar3 = "pam.c: couldn\'t read body";
            }
            puts(pcVar3);
            goto LAB_003cb7a6;
          }
          iVar2 = bcmp(line,"WIDTH",6);
          if (__s1 == (char *)0x0 || iVar2 != 0) {
            iVar2 = bcmp(line,"HEIGHT",7);
            if (iVar2 == 0 && __s1 != (char *)0x0) {
              iVar2 = atoi(__s1);
              __ptr->height = iVar2;
            }
            else {
              iVar2 = bcmp(line,"DEPTH",6);
              if (iVar2 == 0 && __s1 != (char *)0x0) {
                iVar2 = atoi(__s1);
                __ptr->depth = iVar2;
              }
              else {
                iVar2 = bcmp(line,"MAXVAL",7);
                if (iVar2 == 0 && __s1 != (char *)0x0) {
                  iVar2 = atoi(__s1);
                  __ptr->maxval = iVar2;
                }
                else {
                  iVar2 = bcmp(line,"TUPLTYPE",9);
                  if (iVar2 == 0 && __s1 != (char *)0x0) {
                    iVar2 = strcmp(__s1,"GRAYSCALE_ALPHA");
                    if (iVar2 == 0) {
                      __ptr->type = 5000;
                    }
                    else {
                      iVar2 = strcmp(__s1,"RGB_ALPHA");
                      if (iVar2 == 0) {
                        __ptr->type = 0x1389;
                      }
                      else {
                        iVar2 = strcmp(__s1,"RGB");
                        if (iVar2 == 0) {
                          __ptr->type = 0x138a;
                        }
                        else {
                          iVar2 = strcmp(__s1,"GRAYSCALE");
                          if (iVar2 == 0) {
                            __ptr->type = 0x138b;
                          }
                          else {
                            printf("pam.c: unrecognized tupl type %s\n",__s1);
                          }
                        }
                      }
                    }
                  }
                  else {
                    printf("pam.c: unrecognized attribute %s\n",line);
                  }
                }
              }
            }
          }
          else {
            iVar2 = atoi(__s1);
            __ptr->width = iVar2;
          }
        }
      }
    }
    puts("pam.c: unexpected EOF");
LAB_003cb7a6:
    free(__ptr);
    fclose(__stream);
  }
  return (pam_t *)0x0;
}

Assistant:

pam_t *pam_create_from_file(const char *inpath)
{
    FILE *infile = fopen(inpath, "r");
    if (infile == NULL) {
        printf("pam.c: couldn't open input file: %s\n", inpath);
        return NULL;
    }

    pam_t *pam = calloc(1, sizeof(pam_t));
    pam->width = -1;
    pam->height = -1;
    pam->depth = -1;
    pam->maxval = -1;
    pam->type = -1;

    int linenumber = 0;

    while (1) {
        char line[1024];
        if (!fgets(line, sizeof(line), infile)) {
            printf("pam.c: unexpected EOF\n");
            goto fail;
        }
        linenumber++;

        char *tok0 = line;
        char *tok1 = NULL;

        if (line[0] == '#') // comment
            continue;

        size_t linelen = strlen(line);
        for (int idx = 0; idx < linelen; idx++) {
            if (line[idx] == ' ') {
                line[idx] = 0;
                if (tok1) {
                    printf("pam.c: More than two tokens, %s:%d\n", inpath, linenumber);
                }

                tok1 = &line[idx+1];
            }
            if (line[idx] == '\n')
                line[idx] = 0;
        }

        if (!strcmp(tok0, "P7"))
            continue;

        if (!strcmp(tok0, "ENDHDR"))
            break;

        if (!strcmp(tok0, "WIDTH") && tok1) {
            pam->width = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "HEIGHT") && tok1) {
            pam->height = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "DEPTH") && tok1) {
            pam->depth = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "MAXVAL") && tok1) {
            pam->maxval = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "TUPLTYPE") && tok1) {
            if (!strcmp(tok1, "GRAYSCALE_ALPHA")) {
                pam->type = PAM_GRAYSCALE_ALPHA;
                continue;
            }

            if (!strcmp(tok1, "RGB_ALPHA")) {
                pam->type = PAM_RGB_ALPHA;
                continue;
            }

            if (!strcmp(tok1, "RGB")) {
                pam->type = PAM_RGB;
                continue;
            }

            if (!strcmp(tok1, "GRAYSCALE")) {
                pam->type = PAM_GRAYSCALE;
                continue;
            }

            printf("pam.c: unrecognized tupl type %s\n", tok1);
            continue;
        }

        printf("pam.c: unrecognized attribute %s\n", tok0);
    }

    if (pam->width < 0 || pam->height < 0 || pam->depth < 0 ||
        pam->maxval < 0 || pam->type < 0) {
        printf("pam.c: missing required metadata field\n");
        goto fail;
    }

    assert(pam->maxval == 255);

    pam->datalen = pam->width * pam->height * pam->depth;
    pam->data = malloc(pam->datalen);
    if (pam->datalen != fread(pam->data, 1, pam->datalen, infile)) {
        printf("pam.c: couldn't read body\n");
        goto fail;
    }

    fclose(infile);
    return pam;

  fail:
    free(pam);
    fclose(infile);
    return NULL;
}